

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O2

Sbd_Srv_t *
Sbd_ManCutServerStart
          (Gia_Man_t *pGia,Vec_Int_t *vMirrors,Vec_Int_t *vLutLevs,Vec_Int_t *vLevs,Vec_Int_t *vRefs
          ,int nLutSize,int nCutSize,int nCutNum,int fVerbose)

{
  uint __line;
  int iVar1;
  Sbd_Srv_t *pSVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  int nCap;
  char *__assertion;
  timespec local_40;
  
  if (nCutSize < nLutSize) {
    __assertion = "nLutSize <= nCutSize";
    __line = 0x59;
  }
  else if (nCutSize < 0xf) {
    if (nCutSize - 2U < 9) {
      if (nCutNum - 2U < 499) {
        pSVar2 = (Sbd_Srv_t *)calloc(1,0x8d48);
        nCap = 3;
        iVar1 = clock_gettime(3,&local_40);
        if (iVar1 < 0) {
          lVar3 = -1;
        }
        else {
          lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        pSVar2->clkStart = lVar3;
        pSVar2->nLutSize = nLutSize;
        pSVar2->nCutSize = nCutSize;
        pSVar2->nCutNum = nCutNum;
        pSVar2->fVerbose = fVerbose;
        pSVar2->pGia = pGia;
        pSVar2->vMirrors = vMirrors;
        pSVar2->vLutLevs = vLutLevs;
        pSVar2->vLevs = vLevs;
        pSVar2->vRefs = vRefs;
        pVVar4 = Vec_IntAlloc(nCap);
        pSVar2->vCut0 = pVVar4;
        pVVar4 = Vec_IntAlloc(nCap);
        pSVar2->vCut = pVVar4;
        pVVar4 = Vec_IntAlloc(nCap);
        pSVar2->vCutTop = pVVar4;
        pVVar4 = Vec_IntAlloc(nCap);
        pSVar2->vCutBot = pVVar4;
        return pSVar2;
      }
      __assertion = "nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM";
      __line = 0x5c;
    }
    else {
      __assertion = "nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE";
      __line = 0x5b;
    }
  }
  else {
    __assertion = "nCutSize < SBD_CUT_NO_LEAF";
    __line = 0x5a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                ,__line,
                "Sbd_Srv_t *Sbd_ManCutServerStart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
               );
}

Assistant:

Sbd_Srv_t * Sbd_ManCutServerStart( Gia_Man_t * pGia, Vec_Int_t * vMirrors, 
                                   Vec_Int_t * vLutLevs, Vec_Int_t * vLevs, Vec_Int_t * vRefs, 
                                   int nLutSize, int nCutSize, int nCutNum, int fVerbose )
{
    Sbd_Srv_t * p;
    assert( nLutSize <= nCutSize );
    assert( nCutSize < SBD_CUT_NO_LEAF );
    assert( nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE );
    assert( nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM );
    p = ABC_CALLOC( Sbd_Srv_t, 1 );
    p->clkStart = Abc_Clock();
    p->nLutSize = nLutSize;
    p->nCutSize = nCutSize;
    p->nCutNum  = nCutNum;
    p->fVerbose = fVerbose;
    p->pGia     = pGia;
    p->vMirrors = vMirrors;
    p->vLutLevs = vLutLevs;
    p->vLevs    = vLevs;
    p->vRefs    = vRefs;
    p->vCut0    = Vec_IntAlloc( 100 );
    p->vCut     = Vec_IntAlloc( 100 );
    p->vCutTop  = Vec_IntAlloc( 100 );
    p->vCutBot  = Vec_IntAlloc( 100 );
    return p;
}